

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::InitProtobufDefaults(void)

{
  int iVar1;
  
  if (InitProtobufDefaults()::is_inited == '\0') {
    iVar1 = __cxa_guard_acquire(&InitProtobufDefaults()::is_inited);
    if (iVar1 != 0) {
      InitProtobufDefaults::is_inited = InitProtobufDefaultsImpl();
      __cxa_guard_release(&InitProtobufDefaults()::is_inited);
    }
  }
  return;
}

Assistant:

void InitProtobufDefaults() {
  static bool is_inited = InitProtobufDefaultsImpl();
  (void)is_inited;
}